

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.hpp
# Opt level: O2

shared_ptr<helics::Core> __thiscall
helics::CoreFactory::CoreTypeBuilder<helics::zeromq::ZmqCore>::build
          (CoreTypeBuilder<helics::zeromq::ZmqCore> *this,string_view name)

{
  char *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Core> sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  char *local_18;
  
  local_18 = name._M_str;
  std::make_shared<helics::zeromq::ZmqCore,std::basic_string_view<char,std::char_traits<char>>&>
            (&local_28);
  pcVar1 = local_28._M_str;
  local_28._M_str = (char *)0x0;
  (this->super_CoreBuilder)._vptr_CoreBuilder = (_func_int **)local_28._M_len;
  this[1].super_CoreBuilder._vptr_CoreBuilder = (_func_int **)pcVar1;
  local_28._M_len = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28._M_str);
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<helics::Core>)
         sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Core> build(std::string_view name) override
        {
            return std::make_shared<CoreTYPE>(name);
        }